

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeverityControl.cpp
# Opt level: O2

int main(void)

{
  Session *pSVar1;
  atomic<unsigned_long> aVar2;
  Session *pSVar3;
  SessionWriter *pSVar4;
  __atomic_base<unsigned_long> _Var5;
  nanoseconds nVar6;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_00;
  basic_ostream<char,_std::char_traits<char>_> *out;
  allocator local_a65;
  allocator local_a64;
  allocator local_a63;
  allocator local_a62;
  allocator local_a61;
  ConsumeResult local_a60;
  undefined1 local_a40 [48];
  string local_a10 [32];
  string local_9f0 [32];
  uint64_t local_9d0;
  string local_9c8 [32];
  string local_9a8 [32];
  undefined1 local_988 [48];
  string local_958 [32];
  string local_938 [32];
  uint64_t local_918;
  string local_910 [32];
  string local_8f0 [32];
  undefined1 local_8d0 [48];
  string local_8a0 [32];
  string local_880 [32];
  uint64_t local_860;
  string local_858 [32];
  string local_838 [32];
  undefined1 local_818 [48];
  string local_7e8 [32];
  string local_7c8 [32];
  uint64_t local_7a8;
  string local_7a0 [32];
  string local_780 [32];
  undefined1 local_760 [48];
  string local_730 [32];
  string local_710 [32];
  uint64_t local_6f0;
  string local_6e8 [32];
  string local_6c8 [32];
  undefined1 local_6a8 [48];
  string local_678 [32];
  string local_658 [32];
  uint64_t local_638;
  string local_630 [32];
  string local_610 [32];
  undefined1 local_5f0 [48];
  string local_5c0 [32];
  string local_5a0 [32];
  uint64_t local_580;
  string local_578 [32];
  string local_558 [32];
  undefined1 local_538 [48];
  string local_508 [32];
  string local_4e8 [32];
  uint64_t local_4c8;
  string local_4c0 [32];
  string local_4a0 [32];
  undefined1 local_480 [48];
  string local_450 [32];
  string local_430 [32];
  uint64_t local_410;
  string local_408 [32];
  string local_3e8 [32];
  undefined1 local_3c8 [48];
  string local_398 [32];
  string local_378 [32];
  uint64_t local_358;
  string local_350 [32];
  string local_330 [32];
  undefined1 local_310 [48];
  string local_2e0 [32];
  string local_2c0 [32];
  uint64_t local_2a0;
  string local_298 [32];
  string local_278 [32];
  undefined1 local_258 [48];
  string local_228 [32];
  string local_208 [32];
  uint64_t local_1e8;
  string local_1e0 [32];
  string local_1c0 [32];
  undefined1 local_1a0 [48];
  string local_170 [32];
  string local_150 [32];
  uint64_t local_130;
  string local_128 [32];
  string local_108 [32];
  undefined1 local_e8 [48];
  string local_b8 [32];
  string local_98 [32];
  uint64_t local_78;
  string local_70 [32];
  string local_50 [32];
  
  pSVar3 = binlog::default_session();
  pSVar4 = binlog::default_thread_local_writer();
  if ((pSVar4->_session->_minSeverity)._M_i < 0x21) {
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar4 = binlog::default_thread_local_writer();
      pSVar1 = pSVar4->_session;
      local_e8._0_8_ = 0;
      local_e8._8_2_ = trace;
      std::__cxx11::string::string((string *)(local_e8 + 0x10),"main",(allocator *)&local_a60);
      std::__cxx11::string::string(local_b8,"main",&local_a61);
      std::__cxx11::string::string
                (local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/SeverityControl.cpp"
                 ,&local_a62);
      local_78 = 0x13;
      std::__cxx11::string::string(local_70,"Default",&local_a63);
      local_a64 = (allocator)0x0;
      std::__cxx11::string::string(local_50,(char *)&local_a64,&local_a65);
      _Var5._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_e8);
      binlog::EventSource::~EventSource((EventSource *)local_e8);
      LOCK();
      UNLOCK();
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var5._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    pSVar4 = binlog::default_thread_local_writer();
    nVar6 = binlog::clockSinceEpoch();
    binlog::SessionWriter::addEvent<>
              (pSVar4,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar6.__r);
  }
  (pSVar3->_minSeverity)._M_i = no_logs;
  pSVar4 = binlog::default_thread_local_writer();
  if ((pSVar4->_session->_minSeverity)._M_i < 0x401) {
    if (main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar4 = binlog::default_thread_local_writer();
      pSVar1 = pSVar4->_session;
      local_1a0._0_8_ = 0;
      local_1a0._8_2_ = critical;
      std::__cxx11::string::string((string *)(local_1a0 + 0x10),"main",(allocator *)&local_a60);
      std::__cxx11::string::string(local_170,"main",&local_a61);
      std::__cxx11::string::string
                (local_150,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/SeverityControl.cpp"
                 ,&local_a62);
      local_130 = 0x17;
      std::__cxx11::string::string(local_128,"Disabled",&local_a63);
      local_a64 = (allocator)0x0;
      std::__cxx11::string::string(local_108,(char *)&local_a64,&local_a65);
      _Var5._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_1a0);
      binlog::EventSource::~EventSource((EventSource *)local_1a0);
      LOCK();
      UNLOCK();
      main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var5._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i;
    pSVar4 = binlog::default_thread_local_writer();
    nVar6 = binlog::clockSinceEpoch();
    binlog::SessionWriter::addEvent<>
              (pSVar4,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar6.__r);
  }
  (pSVar3->_minSeverity)._M_i = critical;
  pSVar4 = binlog::default_thread_local_writer();
  if ((pSVar4->_session->_minSeverity)._M_i < 0x401) {
    if (main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar4 = binlog::default_thread_local_writer();
      pSVar1 = pSVar4->_session;
      local_258._0_8_ = 0;
      local_258._8_2_ = critical;
      std::__cxx11::string::string((string *)(local_258 + 0x10),"main",(allocator *)&local_a60);
      std::__cxx11::string::string(local_228,"main",&local_a61);
      std::__cxx11::string::string
                (local_208,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/SeverityControl.cpp"
                 ,&local_a62);
      local_1e8 = 0x1a;
      std::__cxx11::string::string(local_1e0,"Enabled",&local_a63);
      local_a64 = (allocator)0x0;
      std::__cxx11::string::string(local_1c0,(char *)&local_a64,&local_a65);
      _Var5._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_258);
      binlog::EventSource::~EventSource((EventSource *)local_258);
      LOCK();
      UNLOCK();
      main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var5._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_2.super___atomic_base<unsigned_long>._M_i;
    pSVar4 = binlog::default_thread_local_writer();
    nVar6 = binlog::clockSinceEpoch();
    binlog::SessionWriter::addEvent<>
              (pSVar4,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar6.__r);
  }
  pSVar4 = binlog::default_thread_local_writer();
  if ((pSVar4->_session->_minSeverity)._M_i < 0x201) {
    if (main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar4 = binlog::default_thread_local_writer();
      pSVar1 = pSVar4->_session;
      local_310._0_8_ = 0;
      local_310._8_2_ = error;
      std::__cxx11::string::string((string *)(local_310 + 0x10),"main",(allocator *)&local_a60);
      std::__cxx11::string::string(local_2e0,"main",&local_a61);
      std::__cxx11::string::string
                (local_2c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/SeverityControl.cpp"
                 ,&local_a62);
      local_2a0 = 0x1b;
      std::__cxx11::string::string(local_298,"Disabled",&local_a63);
      local_a64 = (allocator)0x0;
      std::__cxx11::string::string(local_278,(char *)&local_a64,&local_a65);
      _Var5._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_310);
      binlog::EventSource::~EventSource((EventSource *)local_310);
      LOCK();
      UNLOCK();
      main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var5._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_3.super___atomic_base<unsigned_long>._M_i;
    pSVar4 = binlog::default_thread_local_writer();
    nVar6 = binlog::clockSinceEpoch();
    binlog::SessionWriter::addEvent<>
              (pSVar4,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar6.__r);
  }
  (pSVar3->_minSeverity)._M_i = error;
  pSVar4 = binlog::default_thread_local_writer();
  if ((pSVar4->_session->_minSeverity)._M_i < 0x201) {
    if (main::_binlog_sid_4.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar4 = binlog::default_thread_local_writer();
      pSVar1 = pSVar4->_session;
      local_3c8._0_8_ = 0;
      local_3c8._8_2_ = error;
      std::__cxx11::string::string((string *)(local_3c8 + 0x10),"main",(allocator *)&local_a60);
      std::__cxx11::string::string(local_398,"main",&local_a61);
      std::__cxx11::string::string
                (local_378,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/SeverityControl.cpp"
                 ,&local_a62);
      local_358 = 0x1f;
      std::__cxx11::string::string(local_350,"Enabled",&local_a63);
      local_a64 = (allocator)0x0;
      std::__cxx11::string::string(local_330,(char *)&local_a64,&local_a65);
      _Var5._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_3c8);
      binlog::EventSource::~EventSource((EventSource *)local_3c8);
      LOCK();
      UNLOCK();
      main::_binlog_sid_4.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var5._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_4.super___atomic_base<unsigned_long>._M_i;
    pSVar4 = binlog::default_thread_local_writer();
    nVar6 = binlog::clockSinceEpoch();
    binlog::SessionWriter::addEvent<>
              (pSVar4,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar6.__r);
  }
  pSVar4 = binlog::default_thread_local_writer();
  if ((pSVar4->_session->_minSeverity)._M_i < 0x101) {
    if (main::_binlog_sid_5.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar4 = binlog::default_thread_local_writer();
      pSVar1 = pSVar4->_session;
      local_480._0_8_ = 0;
      local_480._8_2_ = warning;
      std::__cxx11::string::string((string *)(local_480 + 0x10),"main",(allocator *)&local_a60);
      std::__cxx11::string::string(local_450,"main",&local_a61);
      std::__cxx11::string::string
                (local_430,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/SeverityControl.cpp"
                 ,&local_a62);
      local_410 = 0x20;
      std::__cxx11::string::string(local_408,"Disabled",&local_a63);
      local_a64 = (allocator)0x0;
      std::__cxx11::string::string(local_3e8,(char *)&local_a64,&local_a65);
      _Var5._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_480);
      binlog::EventSource::~EventSource((EventSource *)local_480);
      LOCK();
      UNLOCK();
      main::_binlog_sid_5.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var5._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_5.super___atomic_base<unsigned_long>._M_i;
    pSVar4 = binlog::default_thread_local_writer();
    nVar6 = binlog::clockSinceEpoch();
    binlog::SessionWriter::addEvent<>
              (pSVar4,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar6.__r);
  }
  (pSVar3->_minSeverity)._M_i = warning;
  pSVar4 = binlog::default_thread_local_writer();
  if ((pSVar4->_session->_minSeverity)._M_i < 0x101) {
    if (main::_binlog_sid_6.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar4 = binlog::default_thread_local_writer();
      pSVar1 = pSVar4->_session;
      local_538._0_8_ = 0;
      local_538._8_2_ = warning;
      std::__cxx11::string::string((string *)(local_538 + 0x10),"main",(allocator *)&local_a60);
      std::__cxx11::string::string(local_508,"main",&local_a61);
      std::__cxx11::string::string
                (local_4e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/SeverityControl.cpp"
                 ,&local_a62);
      local_4c8 = 0x24;
      std::__cxx11::string::string(local_4c0,"Enabled",&local_a63);
      local_a64 = (allocator)0x0;
      std::__cxx11::string::string(local_4a0,(char *)&local_a64,&local_a65);
      _Var5._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_538);
      binlog::EventSource::~EventSource((EventSource *)local_538);
      LOCK();
      UNLOCK();
      main::_binlog_sid_6.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var5._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_6.super___atomic_base<unsigned_long>._M_i;
    pSVar4 = binlog::default_thread_local_writer();
    nVar6 = binlog::clockSinceEpoch();
    binlog::SessionWriter::addEvent<>
              (pSVar4,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar6.__r);
  }
  pSVar4 = binlog::default_thread_local_writer();
  if ((pSVar4->_session->_minSeverity)._M_i < 0x81) {
    if (main::_binlog_sid_7.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar4 = binlog::default_thread_local_writer();
      pSVar1 = pSVar4->_session;
      local_5f0._0_8_ = 0;
      local_5f0._8_2_ = info;
      std::__cxx11::string::string((string *)(local_5f0 + 0x10),"main",(allocator *)&local_a60);
      std::__cxx11::string::string(local_5c0,"main",&local_a61);
      std::__cxx11::string::string
                (local_5a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/SeverityControl.cpp"
                 ,&local_a62);
      local_580 = 0x25;
      std::__cxx11::string::string(local_578,"Disabled",&local_a63);
      local_a64 = (allocator)0x0;
      std::__cxx11::string::string(local_558,(char *)&local_a64,&local_a65);
      _Var5._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_5f0);
      binlog::EventSource::~EventSource((EventSource *)local_5f0);
      LOCK();
      UNLOCK();
      main::_binlog_sid_7.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var5._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_7.super___atomic_base<unsigned_long>._M_i;
    pSVar4 = binlog::default_thread_local_writer();
    nVar6 = binlog::clockSinceEpoch();
    binlog::SessionWriter::addEvent<>
              (pSVar4,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar6.__r);
  }
  (pSVar3->_minSeverity)._M_i = info;
  pSVar4 = binlog::default_thread_local_writer();
  if ((pSVar4->_session->_minSeverity)._M_i < 0x81) {
    if (main::_binlog_sid_8.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar4 = binlog::default_thread_local_writer();
      pSVar1 = pSVar4->_session;
      local_6a8._0_8_ = 0;
      local_6a8._8_2_ = info;
      std::__cxx11::string::string((string *)(local_6a8 + 0x10),"main",(allocator *)&local_a60);
      std::__cxx11::string::string(local_678,"main",&local_a61);
      std::__cxx11::string::string
                (local_658,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/SeverityControl.cpp"
                 ,&local_a62);
      local_638 = 0x29;
      std::__cxx11::string::string(local_630,"Enabled",&local_a63);
      local_a64 = (allocator)0x0;
      std::__cxx11::string::string(local_610,(char *)&local_a64,&local_a65);
      _Var5._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_6a8);
      binlog::EventSource::~EventSource((EventSource *)local_6a8);
      LOCK();
      UNLOCK();
      main::_binlog_sid_8.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var5._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_8.super___atomic_base<unsigned_long>._M_i;
    pSVar4 = binlog::default_thread_local_writer();
    nVar6 = binlog::clockSinceEpoch();
    binlog::SessionWriter::addEvent<>
              (pSVar4,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar6.__r);
  }
  pSVar4 = binlog::default_thread_local_writer();
  if ((pSVar4->_session->_minSeverity)._M_i < 0x41) {
    if (main::_binlog_sid_9.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar4 = binlog::default_thread_local_writer();
      pSVar1 = pSVar4->_session;
      local_760._0_8_ = 0;
      local_760._8_2_ = debug;
      std::__cxx11::string::string((string *)(local_760 + 0x10),"main",(allocator *)&local_a60);
      std::__cxx11::string::string(local_730,"main",&local_a61);
      std::__cxx11::string::string
                (local_710,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/SeverityControl.cpp"
                 ,&local_a62);
      local_6f0 = 0x2a;
      std::__cxx11::string::string(local_6e8,"Disabled",&local_a63);
      local_a64 = (allocator)0x0;
      std::__cxx11::string::string(local_6c8,(char *)&local_a64,&local_a65);
      _Var5._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_760);
      binlog::EventSource::~EventSource((EventSource *)local_760);
      LOCK();
      UNLOCK();
      main::_binlog_sid_9.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var5._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_9.super___atomic_base<unsigned_long>._M_i;
    pSVar4 = binlog::default_thread_local_writer();
    nVar6 = binlog::clockSinceEpoch();
    binlog::SessionWriter::addEvent<>
              (pSVar4,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar6.__r);
  }
  (pSVar3->_minSeverity)._M_i = debug;
  pSVar4 = binlog::default_thread_local_writer();
  if ((pSVar4->_session->_minSeverity)._M_i < 0x41) {
    if (main::_binlog_sid_10.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar4 = binlog::default_thread_local_writer();
      pSVar1 = pSVar4->_session;
      local_818._0_8_ = 0;
      local_818._8_2_ = debug;
      std::__cxx11::string::string((string *)(local_818 + 0x10),"main",(allocator *)&local_a60);
      std::__cxx11::string::string(local_7e8,"main",&local_a61);
      std::__cxx11::string::string
                (local_7c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/SeverityControl.cpp"
                 ,&local_a62);
      local_7a8 = 0x2e;
      std::__cxx11::string::string(local_7a0,"Enabled",&local_a63);
      local_a64 = (allocator)0x0;
      std::__cxx11::string::string(local_780,(char *)&local_a64,&local_a65);
      _Var5._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_818);
      binlog::EventSource::~EventSource((EventSource *)local_818);
      LOCK();
      UNLOCK();
      main::_binlog_sid_10.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var5._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_10.super___atomic_base<unsigned_long>._M_i;
    pSVar4 = binlog::default_thread_local_writer();
    nVar6 = binlog::clockSinceEpoch();
    binlog::SessionWriter::addEvent<>
              (pSVar4,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar6.__r);
  }
  pSVar4 = binlog::default_thread_local_writer();
  if ((pSVar4->_session->_minSeverity)._M_i < 0x21) {
    if (main::_binlog_sid_11.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar4 = binlog::default_thread_local_writer();
      pSVar1 = pSVar4->_session;
      local_8d0._0_8_ = 0;
      local_8d0._8_2_ = trace;
      std::__cxx11::string::string((string *)(local_8d0 + 0x10),"main",(allocator *)&local_a60);
      std::__cxx11::string::string(local_8a0,"main",&local_a61);
      std::__cxx11::string::string
                (local_880,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/SeverityControl.cpp"
                 ,&local_a62);
      local_860 = 0x2f;
      std::__cxx11::string::string(local_858,"Disabled",&local_a63);
      local_a64 = (allocator)0x0;
      std::__cxx11::string::string(local_838,(char *)&local_a64,&local_a65);
      _Var5._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_8d0);
      binlog::EventSource::~EventSource((EventSource *)local_8d0);
      LOCK();
      UNLOCK();
      main::_binlog_sid_11.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var5._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_11.super___atomic_base<unsigned_long>._M_i;
    pSVar4 = binlog::default_thread_local_writer();
    nVar6 = binlog::clockSinceEpoch();
    binlog::SessionWriter::addEvent<>
              (pSVar4,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar6.__r);
  }
  (pSVar3->_minSeverity)._M_i = trace;
  pSVar4 = binlog::default_thread_local_writer();
  if ((pSVar4->_session->_minSeverity)._M_i < 0x21) {
    if (main::_binlog_sid_12.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar4 = binlog::default_thread_local_writer();
      pSVar1 = pSVar4->_session;
      local_988._0_8_ = 0;
      local_988._8_2_ = trace;
      std::__cxx11::string::string((string *)(local_988 + 0x10),"main",(allocator *)&local_a60);
      std::__cxx11::string::string(local_958,"main",&local_a61);
      std::__cxx11::string::string
                (local_938,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/SeverityControl.cpp"
                 ,&local_a62);
      local_918 = 0x33;
      std::__cxx11::string::string(local_910,"Enabled",&local_a63);
      local_a64 = (allocator)0x0;
      std::__cxx11::string::string(local_8f0,(char *)&local_a64,&local_a65);
      _Var5._M_i = binlog::Session::addEventSource(pSVar1,(EventSource *)local_988);
      binlog::EventSource::~EventSource((EventSource *)local_988);
      LOCK();
      UNLOCK();
      main::_binlog_sid_12.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var5._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_12.super___atomic_base<unsigned_long>._M_i;
    pSVar4 = binlog::default_thread_local_writer();
    nVar6 = binlog::clockSinceEpoch();
    binlog::SessionWriter::addEvent<>
              (pSVar4,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar6.__r);
  }
  (pSVar3->_minSeverity)._M_i = warning;
  pSVar4 = binlog::default_thread_local_writer();
  out = extraout_RDX;
  if ((pSVar4->_session->_minSeverity)._M_i < 0x81) {
    if (main::_binlog_sid_13.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar4 = binlog::default_thread_local_writer();
      pSVar3 = pSVar4->_session;
      local_a40._0_8_ = 0;
      local_a40._8_2_ = info;
      std::__cxx11::string::string((string *)(local_a40 + 0x10),"main",&local_a61);
      std::__cxx11::string::string(local_a10,"main",&local_a62);
      std::__cxx11::string::string
                (local_9f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/SeverityControl.cpp"
                 ,&local_a63);
      local_9d0 = 0x40;
      std::__cxx11::string::string(local_9c8,"Call f: {}",&local_a64);
      f();
      local_a60.bytesConsumed._0_4_ = CONCAT22(local_a60.bytesConsumed._2_2_,0x69);
      std::__cxx11::string::string(local_9a8,(char *)&local_a60,&local_a65);
      _Var5._M_i = binlog::Session::addEventSource(pSVar3,(EventSource *)local_a40);
      binlog::EventSource::~EventSource((EventSource *)local_a40);
      LOCK();
      UNLOCK();
      main::_binlog_sid_13.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var5._M_i;
    }
    aVar2.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_13.super___atomic_base<unsigned_long>._M_i;
    pSVar4 = binlog::default_thread_local_writer();
    nVar6 = binlog::clockSinceEpoch();
    f();
    local_a60.bytesConsumed._0_4_ = 0;
    binlog::SessionWriter::addEvent<int>
              (pSVar4,(uint64_t)aVar2.super___atomic_base<unsigned_long>._M_i,nVar6.__r,
               (int *)&local_a60);
    out = extraout_RDX_00;
  }
  binlog::consume<std::ostream>(&local_a60,(binlog *)&std::cout,out);
  return 0;
}

Assistant:

int main()
{
  binlog::Session& session = binlog::default_session();
  BINLOG_TRACE("Default");
  // Outputs: TRAC Default

  session.setMinSeverity(binlog::Severity::no_logs);
  BINLOG_CRITICAL("Disabled");

  session.setMinSeverity(binlog::Severity::critical);
  BINLOG_CRITICAL("Enabled");
  BINLOG_ERROR("Disabled");
  // Outputs: CRIT Enabled

  session.setMinSeverity(binlog::Severity::error);
  BINLOG_ERROR("Enabled");
  BINLOG_WARN("Disabled");
  // Outputs: ERRO Enabled

  session.setMinSeverity(binlog::Severity::warning);
  BINLOG_WARN("Enabled");
  BINLOG_INFO("Disabled");
  // Outputs: WARN Enabled

  session.setMinSeverity(binlog::Severity::info);
  BINLOG_INFO("Enabled");
  BINLOG_DEBUG("Disabled");
  // Outputs: INFO Enabled

  session.setMinSeverity(binlog::Severity::debug);
  BINLOG_DEBUG("Enabled");
  BINLOG_TRACE("Disabled");
  // Outputs: DEBG Enabled

  session.setMinSeverity(binlog::Severity::trace);
  BINLOG_TRACE("Enabled");
  // Outputs: TRAC Enabled

  // Arguments of disabled severities are not evaluated:

  //[setmin

  session.setMinSeverity(binlog::Severity::warning);
  // trace, debug, info severities are disabled
  //]

  //[noeval
  // after setting min severity to warning above:
  BINLOG_INFO("Call f: {}", f()); // f will not be called
  //]

  binlog::consume(std::cout);
  return 0;
}